

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O0

int nn_xsurveyor_recv(nn_sockbase *self,nn_msg *msg)

{
  size_t sVar1;
  undefined4 *n;
  undefined4 *puVar2;
  nn_fq *in_RSI;
  nn_chunkref *in_RDI;
  nn_xsurveyor *xsurveyor;
  int rc;
  nn_chunkref *self_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  self_00 = in_RDI;
  if (in_RDI == (nn_chunkref *)0x0) {
    self_00 = (nn_chunkref *)0x0;
  }
  local_4 = nn_fq_recv(in_RSI,(nn_msg *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (nn_pipe **)self_00);
  if (-1 < (int)local_4) {
    if ((local_4 & 2) == 0) {
      sVar1 = nn_chunkref_size(self_00);
      if (sVar1 < 4) {
        nn_msg_term((nn_msg *)0x2fb4fe);
        return -0xb;
      }
      sVar1 = nn_chunkref_size(self_00);
      if (sVar1 != 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xsurveyor.c"
                ,0xb1);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_chunkref_term(self_00);
      nn_chunkref_init(in_RDI,(size_t)in_RSI);
      n = (undefined4 *)nn_chunkref_data((nn_chunkref *)in_RSI);
      puVar2 = (undefined4 *)nn_chunkref_data((nn_chunkref *)&(in_RSI->priolist).slots[2].current);
      *n = *puVar2;
      nn_chunkref_trim(self_00,(size_t)n);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_xsurveyor_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xsurveyor *xsurveyor;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);

    rc = nn_fq_recv (&xsurveyor->inpipes, msg, NULL);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {
        if (nn_slow (nn_chunkref_size (&msg->body) < sizeof (uint32_t))) {
            nn_msg_term (msg);
            return -EAGAIN;
        }
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), nn_chunkref_data (&msg->body),
           sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, sizeof (uint32_t));
    }

    return 0;
}